

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument_factory.hpp
# Opt level: O2

string * __thiscall
boost::runtime::
value_interpreter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
::interpret(string *__return_storage_ptr__,
           value_interpreter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           *this,cstring *param_1,cstring *source)

{
  iterator pvVar1;
  iterator pvVar2;
  
  pvVar1 = source->m_begin;
  pvVar2 = source->m_end;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pvVar1,pvVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string interpret( cstring, cstring source ) const
    {
        return std::string( source.begin(), source.size() );
    }